

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatTerm.cpp
# Opt level: O3

size_t Kernel::FlatTerm::getEntryCount(Term *t)

{
  int iVar1;
  uint uVar2;
  Term *pTVar3;
  TermList TVar4;
  int iVar5;
  uint uVar6;
  
  if (((t->_args[0]._content & 0x10) == 0) || (t->_functor != 0)) {
    iVar5 = 0;
    pTVar3 = t;
    if (*(int *)&t->field_0xc < 0) {
      iVar5 = 0;
      do {
        pTVar3 = *(Term **)&(pTVar3->field_9)._vars;
        if (((ulong)pTVar3 & 1) != 0) {
          uVar6 = 3;
          goto LAB_005204b2;
        }
        iVar5 = iVar5 + 2;
      } while (*(int *)&pTVar3->field_0xc < 0);
    }
    uVar6 = (pTVar3->field_9)._vars;
LAB_005204b2:
    uVar6 = iVar5 + uVar6;
    uVar2 = t->_weight;
  }
  else {
    TVar4 = SortHelper::getEqualityArgumentSort((Literal *)t);
    iVar5 = 0;
    pTVar3 = t;
    if (*(int *)&t->field_0xc < 0) {
      iVar5 = 0;
      do {
        pTVar3 = *(Term **)&(pTVar3->field_9)._vars;
        if (((ulong)pTVar3 & 1) != 0) {
          uVar6 = 3;
          goto LAB_005204f6;
        }
        iVar5 = iVar5 + 2;
      } while (*(int *)&pTVar3->field_0xc < 0);
    }
    uVar6 = (pTVar3->field_9)._vars;
LAB_005204f6:
    uVar6 = iVar5 + uVar6;
    if (-1 < *(int *)&t->field_0xc) {
      iVar5 = 1;
      if ((TVar4._content & 1) == 0) {
        if (*(int *)(TVar4._content + 0xc) < 0) {
          iVar5 = 0;
          do {
            TVar4._content = *(ulong *)(TVar4._content + 0x20);
            if ((TVar4._content & 1) != 0) {
              iVar1 = 3;
              goto LAB_00520533;
            }
            iVar5 = iVar5 + 2;
          } while (*(int *)(TVar4._content + 0xc) < 0);
        }
        else {
          iVar5 = 0;
        }
        iVar1 = *(int *)(TVar4._content + 0x20);
LAB_00520533:
        iVar5 = iVar5 + iVar1;
      }
      uVar6 = uVar6 + iVar5;
    }
    uVar2 = t->_weight + 1;
  }
  return (ulong)uVar2 * 3 + (ulong)uVar6 * -2;
}

Assistant:

size_t FlatTerm::getEntryCount(Term* t)
{
  //FUNCTION_ENTRY_COUNT entries per function and one per variable
  if (t->isLiteral() && static_cast<Literal*>(t)->isEquality()) {
    // we add the type to the flat term for equalities as an extra,
    // which requires some additional calculation
    auto sort = SortHelper::getEqualityArgumentSort(static_cast<Literal*>(t));
    unsigned numVarOccs = t->numVarOccs();
    if (!t->isTwoVarEquality()) {
      // in case of non-two-var equalities, the variables in
      // the type are not counted by Term::numVarOccs
      numVarOccs += sort.isVar() ? 1 : sort.term()->numVarOccs();
    }
    // the weight is corrected to be conservative in the
    // monomorphic case, we uncorrect it by adding 1
    return (t->weight()+1)*FUNCTION_ENTRY_COUNT-(FUNCTION_ENTRY_COUNT-1)*numVarOccs;
  }
  return t->weight()*FUNCTION_ENTRY_COUNT-(FUNCTION_ENTRY_COUNT-1)*t->numVarOccs();
}